

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BestLiteralSelector.hpp
# Opt level: O2

void __thiscall
Kernel::
BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
::doSelection(BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
              *this,Clause *c,uint eligible)

{
  Comparison CVar1;
  uint uVar2;
  uint uVar3;
  Literal *l2;
  uint i;
  uint uVar4;
  Literal *pLVar5;
  
  uVar4 = 1;
  pLVar5 = c->_literals[0];
  uVar3 = 0;
  while( true ) {
    if (eligible <= uVar4) break;
    l2 = c->_literals[(int)uVar4];
    CVar1 = LiteralComparators::
            Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
            ::compare(&this->_comp,pLVar5,l2);
    uVar2 = uVar4;
    if (CVar1 != LESS) {
      l2 = pLVar5;
      uVar2 = uVar3;
    }
    uVar4 = uVar4 + 1;
    pLVar5 = l2;
    uVar3 = uVar2;
  }
  if (uVar3 != 0) {
    pLVar5 = c->_literals[0];
    c->_literals[0] = c->_literals[(int)uVar3];
    c->_literals[(int)uVar3] = pLVar5;
  }
  Clause::setSelected(c,1);
  return;
}

Assistant:

void doSelection(Clause* c, unsigned eligible) override
  {
    unsigned besti=0;
    Literal* best=(*c)[0];
    for(unsigned i=1;i<eligible;i++) {
      Literal* lit=(*c)[i];
      if(_comp.compare(best, lit)==LESS) {
        besti=i;
        best=lit;
      }
    }
    if(besti>0) {
      std::swap((*c)[0], (*c)[besti]);
    }
    c->setSelected(1);

#if VDEBUG
    ensureSomeColoredSelected(c, eligible);
    ASS_EQ(c->numSelected(), 1); //if there is colored, it should be selected by the QComparator
#endif
  }